

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O0

p_ply ply_create_to_file(FILE *fp,e_ply_storage_mode storage_mode,p_ply_error_cb error_cb,long idata
                        ,void *pdata)

{
  int iVar1;
  e_ply_storage_mode eVar2;
  long in_RCX;
  p_ply_error_cb in_RDX;
  e_ply_storage_mode in_ESI;
  FILE *in_RDI;
  void *in_R8;
  p_ply ply;
  e_ply_storage_mode local_14;
  p_ply local_8;
  
  iVar1 = ply_type_check();
  if (iVar1 == 0) {
    (*in_RDX)((p_ply)0x0,"Incompatible type system");
    local_8 = (p_ply)0x0;
  }
  else {
    local_8 = ply_alloc();
    if (local_8 == (p_ply)0x0) {
      (*in_RDX)((p_ply)0x0,"Out of memory");
      local_8 = (p_ply)0x0;
    }
    else {
      local_8->idata = in_RCX;
      local_8->pdata = in_R8;
      local_8->io_mode = PLY_WRITE;
      local_14 = in_ESI;
      if (in_ESI == PLY_DEFAULT) {
        local_14 = ply_arch_endian();
      }
      if (local_14 == PLY_ASCII) {
        local_8->odriver = &ply_odriver_ascii;
      }
      else {
        eVar2 = ply_arch_endian();
        if (local_14 == eVar2) {
          local_8->odriver = &ply_odriver_binary;
        }
        else {
          local_8->odriver = &ply_odriver_binary_reverse;
        }
      }
      local_8->storage_mode = local_14;
      local_8->fp = in_RDI;
      local_8->own_fp = 0;
      local_8->error_cb = in_RDX;
    }
  }
  return local_8;
}

Assistant:

p_ply ply_create_to_file(FILE *fp, e_ply_storage_mode storage_mode,
        p_ply_error_cb error_cb, long idata, void *pdata) {
    p_ply ply;
    assert(fp && storage_mode <= PLY_DEFAULT);
    if (!ply_type_check()) {
        error_cb(NULL, "Incompatible type system");
        return NULL;
    }
    ply = ply_alloc();
    if (!ply) {
        error_cb(NULL, "Out of memory");
        return NULL;
    }
    ply->idata = idata;
    ply->pdata = pdata;
    ply->io_mode = PLY_WRITE;
    if (storage_mode == PLY_DEFAULT) storage_mode = ply_arch_endian();
    if (storage_mode == PLY_ASCII) ply->odriver = &ply_odriver_ascii;
    else if (storage_mode == ply_arch_endian())
        ply->odriver = &ply_odriver_binary;
    else ply->odriver = &ply_odriver_binary_reverse;
    ply->storage_mode = storage_mode;
    ply->fp = fp;
    ply->own_fp = 0;
    ply->error_cb = error_cb;
    return ply;
}